

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,string *msg,seconds32 retry_interval)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  pointer paVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pcVar6;
  pointer paVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined3 uVar12;
  char cVar13;
  int iVar14;
  time_point32 now;
  announce_entry *this_00;
  undefined4 extraout_var;
  announce_endpoint *paVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer paVar17;
  long lVar18;
  endpoint *ep;
  endpoint *extraout_RDX;
  endpoint *ep_00;
  endpoint *extraout_RDX_00;
  endpoint *ep_01;
  endpoint *extraout_RDX_01;
  endpoint *extraout_RDX_02;
  pointer paVar19;
  long *plVar20;
  endpoint local_endpoint_1;
  int fails;
  endpoint local_endpoint;
  undefined1 local_b8 [32];
  uint local_98;
  seconds32 local_94;
  announce_entry *local_90;
  libtorrent *local_88;
  string *local_80;
  data_union local_78;
  ulong local_50;
  generic_error_category *local_48;
  
  local_94.__r = retry_interval.__r;
  iVar14 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar14 != '\0') {
    uVar3 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(local_b8,ec->cat_,(ulong)uVar3);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s %s",(ulong)uVar3,local_b8._0_8_,
               (msg->_M_dataplus)._M_p);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
    }
  }
  bVar2 = r->kind;
  local_80 = msg;
  this_00 = find_tracker(this,&r->url);
  if ((bVar2 & 1) == 0) {
    local_98 = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    local_78._20_8_ = 0;
    local_78._0_8_ = 2;
    if (this_00 != (announce_entry *)0x0) {
      paVar19 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar4 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = ((long)paVar4 - (long)paVar19 >> 3) * -0x1111111111111111 >> 2;
      paVar17 = paVar19;
      if (0 < lVar18) {
        p_Var5 = (r->outgoing_socket).m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        paVar17 = paVar19 + lVar18 * 4;
        lVar18 = lVar18 + 1;
        paVar19 = paVar19 + 2;
        do {
          if (p_Var5 == paVar19[-2].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            paVar19 = paVar19 + -2;
            goto LAB_002ced2a;
          }
          if (p_Var5 == paVar19[-1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            paVar19 = paVar19 + -1;
            goto LAB_002ced2a;
          }
          if (p_Var5 == (paVar19->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) goto LAB_002ced2a;
          if (p_Var5 == paVar19[1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            paVar19 = paVar19 + 1;
            goto LAB_002ced2a;
          }
          lVar18 = lVar18 + -1;
          paVar19 = paVar19 + 4;
        } while (1 < lVar18);
      }
      lVar18 = ((long)paVar4 - (long)paVar17 >> 3) * -0x1111111111111111;
      if (lVar18 == 1) {
LAB_002cebe9:
        paVar19 = paVar17;
        if ((r->outgoing_socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi !=
            (paVar17->socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi) {
          paVar19 = paVar4;
        }
      }
      else if (lVar18 == 2) {
LAB_002cebd8:
        paVar19 = paVar17;
        if ((r->outgoing_socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi !=
            (paVar17->socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi) {
          paVar17 = paVar17 + 1;
          goto LAB_002cebe9;
        }
      }
      else {
        paVar19 = paVar4;
        if ((lVar18 == 3) &&
           (paVar19 = paVar17,
           (r->outgoing_socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi !=
           (paVar17->socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)) {
          paVar17 = paVar17 + 1;
          goto LAB_002cebd8;
        }
      }
LAB_002ced2a:
      if (paVar19 == paVar4) {
        p_Var5 = (r->outgoing_socket).m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var5->_M_use_count != 0)) {
          pcVar6 = (r->url)._M_dataplus._M_p;
          aux::listen_socket_handle::get_local_endpoint((endpoint *)&local_50,&r->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)local_b8,(libtorrent *)&local_50,ep_00);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",pcVar6,local_b8._0_8_);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
          }
        }
      }
      else {
        local_88 = (libtorrent *)&paVar19->local_endpoint;
        local_78._0_8_ = *(undefined8 *)&(paVar19->local_endpoint).impl_.data_;
        local_78._8_4_ = *(undefined4 *)((long)&(paVar19->local_endpoint).impl_.data_ + 8);
        local_78._12_4_ = *(undefined4 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0xc);
        local_78._16_4_ = *(undefined4 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0x10);
        local_78._20_8_ = *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0x14);
        local_90 = this_00;
        iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2d])();
        local_b8._0_8_ = CONCAT44(extraout_var_01,iVar14) + 0x3b0;
        local_b8._8_4_ = local_b8._8_4_ & 0xffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
        local_b8[8] = 1;
        iVar14 = *(int *)(CONCAT44(extraout_var_01,iVar14) + 0x330);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
        announce_endpoint::failed(paVar19,iVar14,local_94);
        bVar11 = ec->failed_;
        uVar12 = *(undefined3 *)&ec->field_0x5;
        peVar16 = ec->cat_;
        (paVar19->last_error).val_ = ec->val_;
        (paVar19->last_error).failed_ = bVar11;
        *(undefined3 *)&(paVar19->last_error).field_0x5 = uVar12;
        (paVar19->last_error).cat_ = peVar16;
        std::__cxx11::string::_M_assign((string *)paVar19);
        local_98 = *(ushort *)&paVar19->field_0x74 & 0x7f;
        print_endpoint_abi_cxx11_((string *)local_b8,local_88,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",local_b8._0_8_,
                   (r->url)._M_dataplus._M_p,(ulong)(*(ushort *)&paVar19->field_0x74 & 0x7f));
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
        }
        local_b8._0_8_ = (undefined1 *)0x100000061;
        local_b8._8_4_ = 0x45ff20;
        local_b8._12_4_ = 0;
        iVar14 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
        ep_01 = extraout_RDX;
        this_00 = local_90;
        if (((char)iVar14 == '\0') &&
           (cVar13 = (**(code **)(*(long *)CONCAT44(local_b8._12_4_,local_b8._8_4_) + 0x18))
                               ((long *)CONCAT44(local_b8._12_4_,local_b8._8_4_),ec,
                                local_b8._0_8_ & 0xffffffff), this_00 = local_90,
           ep_01 = extraout_RDX_00, cVar13 == '\0')) {
          local_50 = 0x100000071;
          local_48 = &boost::system::detail::cat_holder<void>::generic_category_instance;
          iVar14 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
          ep_01 = extraout_RDX_01;
          if (((char)iVar14 == '\0') &&
             (iVar14 = (*(local_48->super_error_category)._vptr_error_category[3])
                                 (local_48,ec,local_50 & 0xffffffff), ep_01 = extraout_RDX_02,
             (char)iVar14 == '\0')) goto LAB_002cef4f;
        }
        paVar19->field_0x75 = paVar19->field_0x75 & 0xf7;
        print_endpoint_abi_cxx11_((string *)local_b8,local_88,ep_01);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** disabling endpoint [ep: %s url: %s ]",local_b8._0_8_,
                   (r->url)._M_dataplus._M_p);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
        }
      }
LAB_002cef4f:
      paVar7 = (this->m_trackers).
               super_vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               .
               super__Vector_base<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar16 = http_category();
      if ((peVar16->id_ != 0x8fafd21e25c5e09b) && (peVar16->id_ != 0xb2ab117a257edf0d)) {
        (*peVar16->_vptr_error_category[6])(peVar16,0x19a);
      }
      if (ec->val_ == 0x19a) {
        bVar11 = ec->cat_->id_ == peVar16->id_;
        if (peVar16->id_ == 0) {
          bVar11 = ec->cat_ == peVar16;
        }
        if (bVar11) {
          this_00->fail_limit = '\x01';
        }
      }
      paVar19 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar4 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = ((long)paVar4 - (long)paVar19 >> 3) * -0x1111111111111111 >> 2;
      paVar17 = paVar19;
      if (0 < lVar18) {
        paVar17 = paVar19 + lVar18 * 4;
        lVar18 = lVar18 + 1;
        paVar19 = paVar19 + 2;
        do {
          if ((paVar19[-2].field_0x74 & 0x7f) == 0) {
            paVar19 = paVar19 + -2;
            goto LAB_002cf0f3;
          }
          if ((paVar19[-1].field_0x74 & 0x7f) == 0) {
            paVar19 = paVar19 + -1;
            goto LAB_002cf0f3;
          }
          if ((paVar19->field_0x74 & 0x7f) == 0) goto LAB_002cf0f3;
          if ((paVar19[1].field_0x74 & 0x7f) == 0) {
            paVar19 = paVar19 + 1;
            goto LAB_002cf0f3;
          }
          lVar18 = lVar18 + -1;
          paVar19 = paVar19 + 4;
        } while (1 < lVar18);
      }
      lVar18 = ((long)paVar4 - (long)paVar17 >> 3) * -0x1111111111111111;
      if (lVar18 == 1) {
LAB_002cf080:
        paVar19 = paVar17;
        if ((paVar17->field_0x74 & 0x7f) != 0) {
          paVar19 = paVar4;
        }
      }
      else if (lVar18 == 2) {
LAB_002cf076:
        paVar19 = paVar17;
        if ((paVar17->field_0x74 & 0x7f) != 0) {
          paVar17 = paVar17 + 1;
          goto LAB_002cf080;
        }
      }
      else {
        paVar19 = paVar4;
        if ((lVar18 == 3) && (paVar19 = paVar17, (paVar17->field_0x74 & 0x7f) != 0)) {
          paVar17 = paVar17 + 1;
          goto LAB_002cf076;
        }
      }
LAB_002cf0f3:
      if (paVar19 == paVar4) {
        deprioritize_tracker(this,(int)((ulong)((long)this_00 - (long)paVar7) >> 5) * -0x55555555);
      }
    }
    iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_02,iVar14) + 0x68) & 0x11) == 0) &&
       (r->triggered_manually != true)) goto LAB_002cf19d;
    iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_b8);
    alert_manager::
    emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,std::__cxx11::string_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar14),(torrent_handle *)local_b8,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_78.base,(int *)&local_98,&r->url,ec,
               local_80);
    plVar20 = (long *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  }
  else {
    peVar16 = http_category();
    if ((peVar16->id_ != 0x8fafd21e25c5e09b) && (peVar16->id_ != 0xb2ab117a257edf0d)) {
      (*peVar16->_vptr_error_category[6])(peVar16,0x19a);
    }
    if (ec->val_ == 0x19a) {
      bVar11 = ec->cat_->id_ == peVar16->id_;
      if (peVar16->id_ == 0) {
        bVar11 = ec->cat_ == peVar16;
      }
    }
    else {
      bVar11 = false;
    }
    if ((this_00 != (announce_entry *)0x0) && (bVar11)) {
      this_00->fail_limit = '\x01';
    }
    iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var,iVar14) + 0x68) & 0x11) == 0) &&
       (r->triggered_manually != true)) goto LAB_002cf19d;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._0_8_ = (undefined1 *)0x2;
    if ((this_00 != (announce_entry *)0x0) &&
       (paVar15 = announce_entry::find_endpoint(this_00,&r->outgoing_socket),
       paVar15 != (announce_endpoint *)0x0)) {
      local_b8._0_8_ = *(undefined8 *)&(paVar15->local_endpoint).impl_.data_;
      uVar9 = *(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 8);
      uVar10 = *(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 0x14);
      local_b8._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_b8._20_4_ = (undefined4)uVar10;
      local_b8._24_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      local_b8._8_4_ = (undefined4)uVar9;
      local_b8._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    }
    iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&local_78.base);
    alert_manager::
    emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string_const&,boost::system::error_code_const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar14),(torrent_handle *)&local_78.base,
               (basic_endpoint<boost::asio::ip::tcp> *)local_b8,&r->url,ec);
    plVar20 = (long *)CONCAT44(local_78._12_4_,local_78._8_4_);
  }
  if (plVar20 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar20 + 0xc);
      iVar14 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar14 = *(int *)((long)plVar20 + 0xc);
      *(int *)((long)plVar20 + 0xc) = iVar14 + -1;
    }
    if (iVar14 == 1) {
      (**(code **)(*plVar20 + 0x18))();
    }
  }
LAB_002cf19d:
  uVar8 = *(ulong *)&(this->super_torrent_hot_members).field_0x38;
  if (((((uint)uVar8 >> 0x1a & 1) == 0) && ((uVar8 & 0x18000000) == 0)) || (r->event == '\x03')) {
    announce_with_tracker(this,r->event);
  }
  now = aux::time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s %s", ec.value()
				, ec.message().c_str(), msg.c_str());
		}
#endif
		if (0 == (r.kind & tracker_request::scrape_request))
		{
			// announce request
			announce_entry* ae = find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			if (ae)
			{
				auto aep = std::find_if(ae->endpoints.begin(), ae->endpoints.end()
					, [&](announce_endpoint const& e) { return e.socket == r.outgoing_socket; });

				if (aep != ae->endpoints.end())
				{
					local_endpoint = aep->local_endpoint;
					aep->failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					aep->last_error = ec;
					aep->message = msg;
					fails = aep->fails;
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), aep->fails);
#endif
					// don't try to announce from this endpoint again
					if (ec == boost::system::errc::address_family_not_supported
						|| ec == boost::system::errc::host_unreachable)
					{
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				int const tracker_index = int(ae - m_trackers.data());

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) ae->fail_limit = 1;

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [](announce_endpoint const& ep) { return ep.fails > 0; }))
				{
					deprioritize_tracker(tracker_index);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, r.url, ec, msg);
			}
		}
		else
		{
			announce_entry* ae = find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()))
			{
				// never talk to this tracker again
				if (ae != nullptr) ae->fail_limit = 1;
			}

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae != nullptr)
				{
					auto aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle(), local_endpoint, r.url, ec);
			}
		}
		// announce to the next working tracker
		if ((!m_abort && !is_paused()) || r.event == tracker_request::stopped)
			announce_with_tracker(r.event);
		update_tracker_timer(aux::time_now32());
	}